

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

int __thiscall QAbstractItemViewPrivate::init(QAbstractItemViewPrivate *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  ScrollMode SVar2;
  QObject *pQVar3;
  QAbstractItemView *this_00;
  QStyle *pQVar4;
  long in_FS_OFFSET;
  QAbstractItemView *q;
  undefined4 uVar5;
  ColorRole in_stack_fffffffffffffefc;
  QWidget *in_stack_ffffffffffffff00;
  QObject *parent;
  QAbstractItemDelegate *in_stack_ffffffffffffff18;
  code *this_01;
  ContextType *in_stack_ffffffffffffff48;
  Object *in_stack_ffffffffffffff50;
  undefined8 uVar6;
  offset_in_QAbstractSlider_to_subr in_stack_ffffffffffffff70;
  offset_in_QAbstractSlider_to_subr signal;
  ConnectionType type;
  QAbstractItemViewPrivate *pQVar7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = this;
  pQVar3 = (QObject *)q_func(this);
  type = (ConnectionType)pQVar7;
  parent = pQVar3;
  this_00 = (QAbstractItemView *)operator_new(0x10);
  QStyledItemDelegate::QStyledItemDelegate((QStyledItemDelegate *)this_00,parent);
  QAbstractItemView::setItemDelegate(this_00,in_stack_ffffffffffffff18);
  QAbstractSlider::setRange
            ((QAbstractSlider *)this_00,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
             (int)in_stack_ffffffffffffff18);
  QAbstractSlider::setRange
            ((QAbstractSlider *)this_00,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
             (int)in_stack_ffffffffffffff18);
  this_01 = QAbstractSlider::actionTriggered;
  QObject::connect<void(QAbstractSlider::*)(int),void(QAbstractItemView::*)(int)>
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff70,in_stack_ffffffffffffff48,
             (offset_in_QAbstractItemView_to_subr *)this,type);
  signal = 0;
  QObject::connect<void(QAbstractSlider::*)(int),void(QAbstractItemView::*)(int)>
            (in_stack_ffffffffffffff50,0,in_stack_ffffffffffffff48,
             (offset_in_QAbstractItemView_to_subr *)this,type);
  uVar6 = 0;
  QObject::connect<void(QAbstractSlider::*)(int),void(QAbstractItemView::*)(int)>
            (in_stack_ffffffffffffff50,signal,in_stack_ffffffffffffff48,
             (offset_in_QAbstractItemView_to_subr *)this,type);
  uVar5 = 0;
  QObject::connect<void(QAbstractSlider::*)(int),void(QAbstractItemView::*)(int)>
            ((Object *)0x0,signal,(ContextType *)QAbstractSlider::valueChanged,
             (offset_in_QAbstractItemView_to_subr *)this,type);
  std::array<QMetaObject::Connection,_4UL>::operator=
            ((array<QMetaObject::Connection,_4UL> *)this_00,
             (array<QMetaObject::Connection,_4UL> *)parent);
  std::array<QMetaObject::Connection,_4UL>::~array((array<QMetaObject::Connection,_4UL> *)this_00);
  QWidget::setBackgroundRole(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  QWidget::setAttribute
            ((QWidget *)this_01,(WidgetAttribute)((ulong)uVar6 >> 0x20),
             SUB81((ulong)uVar6 >> 0x18,0));
  pQVar4 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffefc,uVar5));
  SVar2 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x6f,0,pQVar3);
  this->verticalScrollMode = SVar2;
  pQVar4 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffefc,uVar5));
  SVar2 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x6f,0,pQVar3);
  this->horizontalScrollMode = SVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::init()
{
    Q_Q(QAbstractItemView);
    q->setItemDelegate(new QStyledItemDelegate(q));

    vbar->setRange(0, 0);
    hbar->setRange(0, 0);

    scrollbarConnections = {
        QObject::connect(vbar, &QScrollBar::actionTriggered,
                         q, &QAbstractItemView::verticalScrollbarAction),
        QObject::connect(hbar, &QScrollBar::actionTriggered,
                         q, &QAbstractItemView::horizontalScrollbarAction),
        QObject::connect(vbar, &QScrollBar::valueChanged,
                         q, &QAbstractItemView::verticalScrollbarValueChanged),
        QObject::connect(hbar, &QScrollBar::valueChanged,
                         q, &QAbstractItemView::horizontalScrollbarValueChanged)
    };
    viewport->setBackgroundRole(QPalette::Base);

    q->setAttribute(Qt::WA_InputMethodEnabled);

    verticalScrollMode = static_cast<QAbstractItemView::ScrollMode>(q->style()->styleHint(QStyle::SH_ItemView_ScrollMode, nullptr, q, nullptr));
    horizontalScrollMode = static_cast<QAbstractItemView::ScrollMode>(q->style()->styleHint(QStyle::SH_ItemView_ScrollMode, nullptr, q, nullptr));
}